

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzDecompress(bz_stream *strm)

{
  DState *s_00;
  bz_stream *in_RDI;
  Int32 r;
  DState *s;
  Bool corrupt;
  DState *in_stack_00000158;
  Bool local_11;
  Int32 local_4;
  
  if (in_RDI == (bz_stream *)0x0) {
    local_4 = -2;
  }
  else {
    s_00 = (DState *)in_RDI->state;
    if (s_00 == (DState *)0x0) {
      local_4 = -2;
    }
    else if (s_00->strm == in_RDI) {
      do {
        do {
          if (s_00->state == 1) {
            return -1;
          }
          if (s_00->state == 2) {
            if (s_00->smallDecompress == '\0') {
              local_11 = unRLE_obuf_to_output_FAST(s_00);
            }
            else {
              local_11 = unRLE_obuf_to_output_SMALL(s);
            }
            if (local_11 != '\0') {
              return -4;
            }
            if ((s_00->nblock_used != s_00->save_nblock + 1) || (s_00->state_out_len != 0)) {
              return 0;
            }
            s_00->calculatedBlockCRC = s_00->calculatedBlockCRC ^ 0xffffffff;
            if (2 < s_00->verbosity) {
              fprintf(_stderr," {0x%08x, 0x%08x}",(ulong)s_00->storedBlockCRC,
                      (ulong)s_00->calculatedBlockCRC);
            }
            if (1 < s_00->verbosity) {
              fprintf(_stderr,"]");
            }
            if (s_00->calculatedBlockCRC != s_00->storedBlockCRC) {
              return -4;
            }
            s_00->calculatedCombinedCRC =
                 s_00->calculatedCombinedCRC << 1 | s_00->calculatedCombinedCRC >> 0x1f;
            s_00->calculatedCombinedCRC = s_00->calculatedBlockCRC ^ s_00->calculatedCombinedCRC;
            s_00->state = 0xe;
          }
        } while (s_00->state < 10);
        local_4 = BZ2_decompress(in_stack_00000158);
        if (local_4 == 4) {
          if (2 < s_00->verbosity) {
            fprintf(_stderr,"\n    combined CRCs: stored = 0x%08x, computed = 0x%08x",
                    (ulong)s_00->storedCombinedCRC,(ulong)s_00->calculatedCombinedCRC);
          }
          if (s_00->calculatedCombinedCRC == s_00->storedCombinedCRC) {
            return 4;
          }
          return -4;
        }
      } while (s_00->state == 2);
    }
    else {
      local_4 = -2;
    }
  }
  return local_4;
}

Assistant:

int BZ_API(BZ2_bzDecompress) ( bz_stream *strm )
{
   Bool    corrupt;
   DState* s;
   if (strm == NULL) return BZ_PARAM_ERROR;
   s = strm->state;
   if (s == NULL) return BZ_PARAM_ERROR;
   if (s->strm != strm) return BZ_PARAM_ERROR;

   while (True) {
      if (s->state == BZ_X_IDLE) return BZ_SEQUENCE_ERROR;
      if (s->state == BZ_X_OUTPUT) {
         if (s->smallDecompress)
            corrupt = unRLE_obuf_to_output_SMALL ( s ); else
            corrupt = unRLE_obuf_to_output_FAST  ( s );
         if (corrupt) return BZ_DATA_ERROR;
         if (s->nblock_used == s->save_nblock+1 && s->state_out_len == 0) {
            BZ_FINALISE_CRC ( s->calculatedBlockCRC );
            if (s->verbosity >= 3)
               VPrintf2 ( " {0x%08x, 0x%08x}", s->storedBlockCRC,
                          s->calculatedBlockCRC );
            if (s->verbosity >= 2) VPrintf0 ( "]" );
            if (s->calculatedBlockCRC != s->storedBlockCRC)
               return BZ_DATA_ERROR;
            s->calculatedCombinedCRC
               = (s->calculatedCombinedCRC << 1) |
                    (s->calculatedCombinedCRC >> 31);
            s->calculatedCombinedCRC ^= s->calculatedBlockCRC;
            s->state = BZ_X_BLKHDR_1;
         } else {
            return BZ_OK;
         }
      }
      if (s->state >= BZ_X_MAGIC_1) {
         Int32 r = BZ2_decompress ( s );
         if (r == BZ_STREAM_END) {
            if (s->verbosity >= 3)
               VPrintf2 ( "\n    combined CRCs: stored = 0x%08x, computed = 0x%08x",
                          s->storedCombinedCRC, s->calculatedCombinedCRC );
            if (s->calculatedCombinedCRC != s->storedCombinedCRC)
               return BZ_DATA_ERROR;
            return r;
         }
         if (s->state != BZ_X_OUTPUT) return r;
      }
   }

   AssertH ( 0, 6001 );

   return 0;  /*NOTREACHED*/
}